

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O0

BeagleBenchmarkedResourceList *
beagleGetBenchmarkedResourceList
          (int tipCount,int compactBufferCount,int stateCount,int patternCount,int categoryCount,
          int *resourceList,int resourceCount,long preferenceFlags,long requirementFlags,
          int eigenModelCount,int partitionCount,int calculateDerivatives,long benchmarkFlags)

{
  long lVar1;
  char *pcVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  void *pvVar6;
  reference ppVar7;
  size_type sVar8;
  BeagleBenchmarkedResource *pBVar9;
  reference paVar10;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int in_R8D;
  double dVar11;
  ulong in_stack_00000010;
  ulong in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  uint in_stack_00000038;
  iterator it_2;
  int i;
  double itBenchmarkResult;
  iterator it_1;
  bool instOnly;
  double benchmarkResultCPU;
  long benchedFlags;
  char *implName;
  int resourceNumber;
  int rescaleFrequency;
  int benchmarkReplicates;
  bool manualScaling;
  BeagleBenchmarkedResource itResource;
  int resource;
  iterator it;
  RsrcBenchPairList *filteredRsrcBenchList;
  PairedList *possibleResources;
  int errorCode;
  _func_bool_anon_struct_80_10_315a9382_ptr_anon_struct_80_10_315a9382_ptr *in_stack_00000498;
  list<BeagleBenchmarkedResource,_std::allocator<BeagleBenchmarkedResource>_> *in_stack_000004a0;
  undefined4 in_stack_fffffffffffffdc8;
  int iVar12;
  undefined4 in_stack_fffffffffffffdcc;
  int iVar13;
  undefined4 in_stack_fffffffffffffdd4;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  PairedList *in_stack_fffffffffffffe48;
  long in_stack_fffffffffffffe50;
  long in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  int *in_stack_fffffffffffffe68;
  _Self local_138;
  _Self local_130;
  int local_124;
  double local_120;
  _Self local_118;
  _Self local_110;
  byte local_101;
  double local_100;
  long local_f8;
  char *local_f0;
  int local_e8;
  int local_e4;
  int local_e0;
  byte local_d9;
  int local_d8;
  char *local_d0;
  char *local_c8;
  long local_c0;
  long local_b8;
  int local_84;
  _Self local_80;
  _Self local_78;
  void *local_70;
  void *local_68;
  int local_5c;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  BeagleBenchmarkedResourceList *local_38;
  
  iVar12 = (int)((ulong)in_stack_fffffffffffffe60 >> 0x20);
  local_4c = in_R8D;
  local_48 = in_ECX;
  local_44 = in_EDX;
  local_40 = in_ESI;
  local_3c = in_EDI;
  if (rsrcList == (BeagleResourceList *)0x0) {
    beagleGetResourceList();
  }
  if (implFactory_abi_cxx11_ ==
      (list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> *)0x0) {
    beagleGetFactoryList_abi_cxx11_();
  }
  local_5c = 0;
  pvVar6 = operator_new(0x18);
  std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::list
            ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x12041a);
  local_68 = pvVar6;
  local_5c = filterResources(in_stack_fffffffffffffe68,iVar12,in_stack_fffffffffffffe58,
                             in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  pvVar6 = local_68;
  if (local_5c == 0) {
    pvVar6 = operator_new(0x18);
    std::__cxx11::list<BeagleBenchmarkedResource,_std::allocator<BeagleBenchmarkedResource>_>::list
              ((list<BeagleBenchmarkedResource,_std::allocator<BeagleBenchmarkedResource>_> *)
               0x1204c2);
    local_70 = pvVar6;
    local_78._M_node =
         (_List_node_base *)
         std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                   ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                    CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    while( true ) {
      local_80._M_node =
           (_List_node_base *)
           std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                     ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                      CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      bVar4 = std::operator!=(&local_78,&local_80);
      pvVar6 = local_68;
      if (!bVar4) break;
      ppVar7 = std::_List_iterator<std::pair<int,_int>_>::operator*
                         ((_List_iterator<std::pair<int,_int>_> *)0x120527);
      local_d8 = ppVar7->second;
      local_d0 = rsrcList->list[local_d8].name;
      local_c8 = rsrcList->list[local_d8].description;
      local_c0 = rsrcList->list[local_d8].supportFlags;
      local_b8 = rsrcList->list[local_d8].requiredFlags;
      local_84 = local_d8;
      std::__cxx11::list<BeagleBenchmarkedResource,_std::allocator<BeagleBenchmarkedResource>_>::
      push_back((list<BeagleBenchmarkedResource,_std::allocator<BeagleBenchmarkedResource>_> *)
                CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                (value_type *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      std::_List_iterator<std::pair<int,_int>_>::operator++(&local_78);
    }
    if (local_68 != (void *)0x0) {
      std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~list
                ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x120628);
      operator_delete(pvVar6);
    }
    local_d9 = (in_stack_00000038 & 1) == 0;
    local_e0 = 0xf;
    local_e4 = 0x1e;
    if ((in_stack_00000038 & 2) != 0) {
      local_e4 = 1;
    }
    local_101 = 0;
    iVar12 = 0xf;
    iVar13 = local_40;
    local_5c = beagle::benchmark::benchmarkResource
                         (0,local_44,local_3c,local_48,(bool)local_d9,local_4c,0xf,local_40,local_e4
                          ,(bool)(-(in_stack_00000030 != 0) & 1),in_stack_00000030 != 0,
                          in_stack_00000020,in_stack_00000028,in_stack_00000010 | in_stack_00000018,
                          0,&local_e8,&local_f0,&local_f8,&local_100,false);
    if (local_5c == 0) {
      local_110._M_node =
           (_List_node_base *)
           std::__cxx11::list<BeagleBenchmarkedResource,_std::allocator<BeagleBenchmarkedResource>_>
           ::begin((list<BeagleBenchmarkedResource,_std::allocator<BeagleBenchmarkedResource>_> *)
                   CONCAT44(in_stack_fffffffffffffdcc,iVar12));
      while( true ) {
        local_118._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<BeagleBenchmarkedResource,_std::allocator<BeagleBenchmarkedResource>_>::end
                       ((list<BeagleBenchmarkedResource,_std::allocator<BeagleBenchmarkedResource>_>
                         *)CONCAT44(in_stack_fffffffffffffdcc,iVar12));
        bVar4 = std::operator!=(&local_110,&local_118);
        if (!bVar4) break;
        paVar10 = std::_List_iterator<BeagleBenchmarkedResource>::operator*
                            ((_List_iterator<BeagleBenchmarkedResource> *)0x120805);
        local_101 = paVar10->number == 0;
        paVar10 = std::_List_iterator<BeagleBenchmarkedResource>::operator*
                            ((_List_iterator<BeagleBenchmarkedResource> *)0x120829);
        iVar12 = local_e0;
        iVar13 = local_40;
        iVar5 = beagle::benchmark::benchmarkResource
                          (paVar10->number,local_44,local_3c,local_48,(bool)(local_d9 & 1),local_4c,
                           local_e0,local_40,local_e4,(bool)(-(in_stack_00000030 != 0) & 1),
                           in_stack_00000030 != 0,in_stack_00000020,in_stack_00000028,
                           in_stack_00000010,in_stack_00000018,&local_e8,&local_f0,&local_f8,
                           &local_120,(bool)(local_101 & 1));
        paVar10 = std::_List_iterator<BeagleBenchmarkedResource>::operator*
                            ((_List_iterator<BeagleBenchmarkedResource> *)0x12096e);
        iVar3 = local_e8;
        paVar10->returnCode = iVar5;
        paVar10 = std::_List_iterator<BeagleBenchmarkedResource>::operator*
                            ((_List_iterator<BeagleBenchmarkedResource> *)0x120993);
        lVar1 = local_f8;
        paVar10->number = iVar3;
        paVar10 = std::_List_iterator<BeagleBenchmarkedResource>::operator*
                            ((_List_iterator<BeagleBenchmarkedResource> *)0x1209b9);
        pcVar2 = local_f0;
        paVar10->benchedFlags = lVar1;
        paVar10 = std::_List_iterator<BeagleBenchmarkedResource>::operator*
                            ((_List_iterator<BeagleBenchmarkedResource> *)0x1209e2);
        paVar10->implName = pcVar2;
        paVar10 = std::_List_iterator<BeagleBenchmarkedResource>::operator*
                            ((_List_iterator<BeagleBenchmarkedResource> *)0x1209fb);
        dVar11 = local_120;
        if (paVar10->number == 0) {
          dVar11 = local_100;
          paVar10 = std::_List_iterator<BeagleBenchmarkedResource>::operator*
                              ((_List_iterator<BeagleBenchmarkedResource> *)0x120a1f);
          paVar10->benchmarkResult = dVar11;
          paVar10 = std::_List_iterator<BeagleBenchmarkedResource>::operator*
                              ((_List_iterator<BeagleBenchmarkedResource> *)0x120a3a);
          paVar10->performanceRatio = 1.0;
        }
        else {
          paVar10 = std::_List_iterator<BeagleBenchmarkedResource>::operator*
                              ((_List_iterator<BeagleBenchmarkedResource> *)0x120a65);
          paVar10->benchmarkResult = dVar11;
          dVar11 = local_100;
          paVar10 = std::_List_iterator<BeagleBenchmarkedResource>::operator*
                              ((_List_iterator<BeagleBenchmarkedResource> *)0x120a8f);
          dVar11 = dVar11 / paVar10->benchmarkResult;
          paVar10 = std::_List_iterator<BeagleBenchmarkedResource>::operator*
                              ((_List_iterator<BeagleBenchmarkedResource> *)0x120ab3);
          paVar10->performanceRatio = dVar11;
        }
        std::_List_iterator<BeagleBenchmarkedResource>::operator++(&local_110);
      }
      std::__cxx11::list<BeagleBenchmarkedResource,std::allocator<BeagleBenchmarkedResource>>::
      sort<bool(*)(BeagleBenchmarkedResource_const&,BeagleBenchmarkedResource_const&)>
                (in_stack_000004a0,in_stack_00000498);
      if (rsrcBenchList != (BeagleBenchmarkedResourceList *)0x0) {
        free(rsrcBenchList->list);
        free(rsrcBenchList);
      }
      rsrcBenchList = (BeagleBenchmarkedResourceList *)malloc(0x10);
      sVar8 = std::__cxx11::
              list<BeagleBenchmarkedResource,_std::allocator<BeagleBenchmarkedResource>_>::size
                        ((list<BeagleBenchmarkedResource,_std::allocator<BeagleBenchmarkedResource>_>
                          *)CONCAT44(in_stack_fffffffffffffdd4,iVar13));
      rsrcBenchList->length = (int)sVar8;
      pBVar9 = (BeagleBenchmarkedResource *)malloc((long)rsrcBenchList->length * 0x50);
      rsrcBenchList->list = pBVar9;
      local_124 = 0;
      local_130._M_node =
           (_List_node_base *)
           std::__cxx11::list<BeagleBenchmarkedResource,_std::allocator<BeagleBenchmarkedResource>_>
           ::begin((list<BeagleBenchmarkedResource,_std::allocator<BeagleBenchmarkedResource>_> *)
                   CONCAT44(in_stack_fffffffffffffdcc,iVar12));
      while( true ) {
        local_138._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<BeagleBenchmarkedResource,_std::allocator<BeagleBenchmarkedResource>_>::end
                       ((list<BeagleBenchmarkedResource,_std::allocator<BeagleBenchmarkedResource>_>
                         *)CONCAT44(in_stack_fffffffffffffdcc,iVar12));
        bVar4 = std::operator!=(&local_130,&local_138);
        pvVar6 = local_70;
        if (!bVar4) break;
        paVar10 = std::_List_iterator<BeagleBenchmarkedResource>::operator*
                            ((_List_iterator<BeagleBenchmarkedResource> *)0x120bd1);
        rsrcBenchList->list[local_124].number = paVar10->number;
        paVar10 = std::_List_iterator<BeagleBenchmarkedResource>::operator*
                            ((_List_iterator<BeagleBenchmarkedResource> *)0x120bfe);
        rsrcBenchList->list[local_124].name = paVar10->name;
        paVar10 = std::_List_iterator<BeagleBenchmarkedResource>::operator*
                            ((_List_iterator<BeagleBenchmarkedResource> *)0x120c2f);
        rsrcBenchList->list[local_124].description = paVar10->description;
        paVar10 = std::_List_iterator<BeagleBenchmarkedResource>::operator*
                            ((_List_iterator<BeagleBenchmarkedResource> *)0x120c60);
        rsrcBenchList->list[local_124].supportFlags = paVar10->supportFlags;
        paVar10 = std::_List_iterator<BeagleBenchmarkedResource>::operator*
                            ((_List_iterator<BeagleBenchmarkedResource> *)0x120c91);
        rsrcBenchList->list[local_124].requiredFlags = paVar10->requiredFlags;
        paVar10 = std::_List_iterator<BeagleBenchmarkedResource>::operator*
                            ((_List_iterator<BeagleBenchmarkedResource> *)0x120cc2);
        rsrcBenchList->list[local_124].returnCode = paVar10->returnCode;
        paVar10 = std::_List_iterator<BeagleBenchmarkedResource>::operator*
                            ((_List_iterator<BeagleBenchmarkedResource> *)0x120cf1);
        rsrcBenchList->list[local_124].implName = paVar10->implName;
        paVar10 = std::_List_iterator<BeagleBenchmarkedResource>::operator*
                            ((_List_iterator<BeagleBenchmarkedResource> *)0x120d22);
        rsrcBenchList->list[local_124].benchedFlags = paVar10->benchedFlags;
        paVar10 = std::_List_iterator<BeagleBenchmarkedResource>::operator*
                            ((_List_iterator<BeagleBenchmarkedResource> *)0x120d53);
        rsrcBenchList->list[local_124].benchmarkResult = paVar10->benchmarkResult;
        paVar10 = std::_List_iterator<BeagleBenchmarkedResource>::operator*
                            ((_List_iterator<BeagleBenchmarkedResource> *)0x120d86);
        rsrcBenchList->list[local_124].performanceRatio = paVar10->performanceRatio;
        local_124 = local_124 + 1;
        std::_List_iterator<BeagleBenchmarkedResource>::operator++(&local_130);
      }
      if (local_70 != (void *)0x0) {
        std::__cxx11::list<BeagleBenchmarkedResource,_std::allocator<BeagleBenchmarkedResource>_>::
        ~list((list<BeagleBenchmarkedResource,_std::allocator<BeagleBenchmarkedResource>_> *)
              0x120dec);
        operator_delete(pvVar6);
      }
      local_38 = rsrcBenchList;
    }
    else {
      local_38 = (BeagleBenchmarkedResourceList *)0x0;
    }
  }
  else {
    if (local_68 != (void *)0x0) {
      std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~list
                ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x12048a);
      operator_delete(pvVar6);
    }
    local_38 = (BeagleBenchmarkedResourceList *)0x0;
  }
  return local_38;
}

Assistant:

BeagleBenchmarkedResourceList* beagleGetBenchmarkedResourceList(int tipCount,
                                                                int compactBufferCount,
                                                                int stateCount,
                                                                int patternCount,
                                                                int categoryCount,
                                                                int* resourceList,
                                                                int resourceCount,
                                                                long preferenceFlags,
                                                                long requirementFlags,
                                                                int eigenModelCount,
                                                                int partitionCount,
                                                                int calculateDerivatives,
                                                                long benchmarkFlags) {

#ifdef BEAGLE_DEBUG_FP_REDUCED_PRECISION
    debugPatternCount = patternCount;
#endif

    if (rsrcList == NULL)
        beagleGetResourceList();

    if (implFactory == NULL)
        beagleGetFactoryList();

    int errorCode = BEAGLE_SUCCESS;

    PairedList* possibleResources = new PairedList;

    errorCode = filterResources(resourceList,
                                resourceCount,
                                preferenceFlags,
                                requirementFlags,
                                possibleResources);

    if (errorCode != BEAGLE_SUCCESS) {
        delete possibleResources;
        return NULL;
    }

    RsrcBenchPairList *filteredRsrcBenchList = new RsrcBenchPairList;

    for(PairedList::iterator it = possibleResources->begin(); it != possibleResources->end(); ++it) {
        int resource = (*it).second;

        BeagleBenchmarkedResource itResource;
        itResource.number        = resource;
        itResource.name          = rsrcList->list[resource].name;
        itResource.description   = rsrcList->list[resource].description;
        itResource.supportFlags  = rsrcList->list[resource].supportFlags;
        itResource.requiredFlags = rsrcList->list[resource].requiredFlags;

        filteredRsrcBenchList->push_back(itResource);
    }

    delete possibleResources;

    bool manualScaling = (benchmarkFlags & BEAGLE_BENCHFLAG_SCALING_NONE ? false : true);
    int benchmarkReplicates = BENCHMARK_REPLICATES;
    int rescaleFrequency =
        (benchmarkFlags & BEAGLE_BENCHFLAG_SCALING_ALWAYS ? 1 : BENCHMARK_REPLICATES*2);

    int resourceNumber;
    char* implName;
    long benchedFlags;
    double benchmarkResultCPU;

    bool instOnly = false;

    errorCode = beagle::benchmark::benchmarkResource(0,
                                  stateCount,
                                  tipCount,
                                  patternCount,
                                  manualScaling,
                                  categoryCount,
                                  benchmarkReplicates,
                                  compactBufferCount,
                                  rescaleFrequency,
                                  (calculateDerivatives ? true : false),
                                  calculateDerivatives,
                                  eigenModelCount,
                                  partitionCount,
                                  preferenceFlags | requirementFlags,
                                  0,
                                  &resourceNumber,
                                  &implName,
                                  &benchedFlags,
                                  &benchmarkResultCPU,
                                  instOnly);

    if (errorCode != BEAGLE_SUCCESS) {
        return NULL;
    }

    for(RsrcBenchPairList::iterator it = filteredRsrcBenchList->begin();
        it != filteredRsrcBenchList->end(); ++it) {

        if ((*it).number == 0) {
            instOnly = true;
        } else {
            instOnly = false;
        }

        double itBenchmarkResult;

        (*it).returnCode = beagle::benchmark::benchmarkResource((*it).number,
                                                     stateCount,
                                                     tipCount,
                                                     patternCount,
                                                     manualScaling,
                                                     categoryCount,
                                                     benchmarkReplicates,
                                                     compactBufferCount,
                                                     rescaleFrequency,
                                                     (calculateDerivatives ? true : false),
                                                     calculateDerivatives,
                                                     eigenModelCount,
                                                     partitionCount,
                                                     preferenceFlags,
                                                     requirementFlags,
                                                     &resourceNumber,
                                                     &implName,
                                                     &benchedFlags,
                                                     &itBenchmarkResult,
                                                     instOnly);

        (*it).number         = resourceNumber;
        (*it).benchedFlags   = benchedFlags;
        (*it).implName       = implName;

        if ((*it).number == 0) {
            (*it).benchmarkResult = benchmarkResultCPU;
            (*it).performanceRatio = 1.0;
        } else {
            (*it).benchmarkResult = itBenchmarkResult;
            (*it).performanceRatio = benchmarkResultCPU / (*it).benchmarkResult;
        }
    }

    filteredRsrcBenchList->sort(compareBenchmarkResult); // order from fastest to slowest

   if (rsrcBenchList != NULL) {
        free(rsrcBenchList->list);
        free(rsrcBenchList);
    }

    rsrcBenchList = (BeagleBenchmarkedResourceList*) malloc(sizeof(BeagleBenchmarkedResourceList));
    rsrcBenchList->length = filteredRsrcBenchList->size();
    rsrcBenchList->list = (BeagleBenchmarkedResource*) malloc(sizeof(BeagleBenchmarkedResource) * rsrcBenchList->length);

    int i = 0;
    for(RsrcBenchPairList::iterator it = filteredRsrcBenchList->begin();
        it != filteredRsrcBenchList->end(); ++it) {
        rsrcBenchList->list[i].number           = (*it).number;
        rsrcBenchList->list[i].name             = (*it).name;
        rsrcBenchList->list[i].description      = (*it).description;
        rsrcBenchList->list[i].supportFlags     = (*it).supportFlags;
        rsrcBenchList->list[i].requiredFlags    = (*it).requiredFlags;
        rsrcBenchList->list[i].returnCode       = (*it).returnCode;
        rsrcBenchList->list[i].implName         = (*it).implName;
        rsrcBenchList->list[i].benchedFlags     = (*it).benchedFlags;
        rsrcBenchList->list[i].benchmarkResult  = (*it).benchmarkResult;
        rsrcBenchList->list[i].performanceRatio = (*it).performanceRatio;
        i++;
    }

    delete filteredRsrcBenchList;

    return rsrcBenchList;
}